

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_expr.cpp
# Opt level: O0

any * __thiscall Omega_h::CallOp::eval(any *__return_storage_ptr__,CallOp *this,ExprEnv *env)

{
  bool bVar1;
  size_type sVar2;
  __shared_ptr_access<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_00;
  element_type *peVar3;
  reference this_01;
  ostream *poVar4;
  ParserFail *this_02;
  pointer ppVar5;
  any *val;
  string local_218 [48];
  stringstream local_1e8 [8];
  stringstream ss;
  ostream local_1d8 [376];
  _Self local_60;
  _Self local_58;
  iterator fit;
  _Self local_48;
  iterator vit;
  ulong local_28;
  size_t i;
  ExprEnv *env_local;
  CallOp *this_local;
  any *result;
  
  sVar2 = std::
          vector<std::shared_ptr<Omega_h::ExprOp>,_std::allocator<std::shared_ptr<Omega_h::ExprOp>_>_>
          ::size(&this->rhs);
  std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>::resize(&this->args,sVar2);
  for (local_28 = 0;
      sVar2 = std::
              vector<std::shared_ptr<Omega_h::ExprOp>,_std::allocator<std::shared_ptr<Omega_h::ExprOp>_>_>
              ::size(&this->rhs), local_28 < sVar2; local_28 = local_28 + 1) {
    this_00 = (__shared_ptr_access<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
              std::
              vector<std::shared_ptr<Omega_h::ExprOp>,_std::allocator<std::shared_ptr<Omega_h::ExprOp>_>_>
              ::operator[](&this->rhs,local_28);
    peVar3 = std::__shared_ptr_access<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->(this_00);
    (*peVar3->_vptr_ExprOp[2])(&vit,peVar3,env);
    this_01 = std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>::operator[]
                        (&this->args,local_28);
    any::operator=(this_01,(any *)&vit);
    any::~any((any *)&vit);
  }
  local_48._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Omega_h::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Omega_h::any>_>_>
       ::find(&env->variables,&this->name);
  fit._M_node = (_Base_ptr)
                std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Omega_h::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Omega_h::any>_>_>
                ::end(&env->variables);
  bVar1 = std::operator==(&local_48,(_Self *)&fit);
  if (bVar1) {
    local_58._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<Omega_h::any_(std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>_&)>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<Omega_h::any_(std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>_&)>_>_>_>
         ::find(&env->functions,&this->name);
    local_60._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<Omega_h::any_(std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>_&)>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<Omega_h::any_(std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>_&)>_>_>_>
         ::end(&env->functions);
    bVar1 = std::operator==(&local_58,&local_60);
    if (bVar1) {
      std::__cxx11::stringstream::stringstream(local_1e8);
      poVar4 = std::operator<<(local_1d8,"\"");
      poVar4 = std::operator<<(poVar4,(string *)&this->name);
      std::operator<<(poVar4,"\" is neither a variable nor a function name\n");
      this_02 = (ParserFail *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringstream::str();
      ParserFail::ParserFail(this_02,local_218);
      __cxa_throw(this_02,&ParserFail::typeinfo,ParserFail::~ParserFail);
    }
    ppVar5 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<Omega_h::any_(std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>_&)>_>_>
             ::operator->(&local_58);
    std::function<Omega_h::any_(std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>_&)>::
    operator()(__return_storage_ptr__,&ppVar5->second,&this->args);
    std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>::clear(&this->args);
  }
  else {
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Omega_h::any>_>
    ::operator->(&local_48);
    anon_unknown_41::access((char *)__return_storage_ptr__,env->size);
    std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>::clear(&this->args);
  }
  return __return_storage_ptr__;
}

Assistant:

any CallOp::eval(ExprEnv& env) {
  args.resize(rhs.size());
  for (std::size_t i = 0; i < rhs.size(); ++i) {
    args[i] = rhs[i]->eval(env);
  }
  auto vit = env.variables.find(name);
  if (vit == env.variables.end()) {
    /* function call */
    auto fit = env.functions.find(name);
    if (fit == env.functions.end()) {
      std::stringstream ss;
      ss << "\"" << name << "\" is neither a variable nor a function name\n";
      throw ParserFail(ss.str());
    }
    auto result = fit->second(args);
    args.clear();
    return result;
  } else {
    /* access operator for vector/matrix */
    auto& val = vit->second;
    auto result = access(env.size, env.dim, val, args);
    args.clear();
    return result;
  }
}